

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefArrayVectorOf<char16_t> **objToLoad,int initSize,bool toAdopt,
               XSerializeEngine *serEng)

{
  char16_t *pcVar1;
  bool bVar2;
  MemoryManager *pMVar3;
  BaseRefVectorOf<char16_t> *pBVar4;
  XMLSize_t XVar5;
  ulong uVar6;
  XMLCh *data;
  XMLSize_t vectorSize;
  XMLSize_t dummyDataLen;
  XMLSize_t dummyBufferLen;
  char16_t *local_50;
  XMLSize_t local_48;
  XMLSize_t local_40;
  XMLSize_t local_38;
  
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    if (*objToLoad == (RefArrayVectorOf<char16_t> *)0x0) {
      pMVar3 = XSerializeEngine::getMemoryManager(serEng);
      pBVar4 = (BaseRefVectorOf<char16_t> *)XMemory::operator_new(0x30,pMVar3);
      pMVar3 = XSerializeEngine::getMemoryManager(serEng);
      XVar5 = 0x10;
      if (-1 < initSize) {
        XVar5 = (XMLSize_t)(uint)initSize;
      }
      BaseRefVectorOf<char16_t>::BaseRefVectorOf(pBVar4,XVar5,toAdopt,pMVar3);
      pBVar4->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefArrayVectorOf_0040c128;
      *objToLoad = (RefArrayVectorOf<char16_t> *)pBVar4;
    }
    XSerializeEngine::registerObject(serEng,*objToLoad);
    local_48 = 0;
    XSerializeEngine::readSize(serEng,&local_48);
    if (local_48 != 0) {
      uVar6 = 0;
      do {
        XSerializeEngine::readString(serEng,&local_50,&local_38,&local_40,false);
        pcVar1 = local_50;
        pBVar4 = &(*objToLoad)->super_BaseRefVectorOf<char16_t>;
        BaseRefVectorOf<char16_t>::ensureExtraCapacity(pBVar4,1);
        XVar5 = pBVar4->fCurCount;
        pBVar4->fElemList[XVar5] = pcVar1;
        pBVar4->fCurCount = XVar5 + 1;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_48);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefArrayVectorOf<XMLCh>**  objToLoad
                                   , int                        initSize
                                   , bool                       toAdopt
                                   , XSerializeEngine&          serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             RefArrayVectorOf<XMLCh>(
                                                     initSize
                                                   , toAdopt
                                                   , serEng.getMemoryManager()
                                                   );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorSize = 0;
        serEng.readSize (vectorSize);

        for (XMLSize_t i = 0; i < vectorSize; i++)
        {
            XMLCh* data;
            serEng.readString(data);
            (*objToLoad)->addElement(data);
        }
    }

}